

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c003::TestCheckEqualFailureIncludesCheckExpectedAndActual::
~TestCheckEqualFailureIncludesCheckExpectedAndActual
          (TestCheckEqualFailureIncludesCheckExpectedAndActual *this)

{
  TestCheckEqualFailureIncludesCheckExpectedAndActual *this_local;
  
  ~TestCheckEqualFailureIncludesCheckExpectedAndActual(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckEqualFailureIncludesCheckExpectedAndActual)
{
    RecordingReporter reporter;
    TestResults results(&reporter);
    const int something = 2;
    CheckEqual(results, 1, something, TestDetails("", "", "", 0));

	using namespace std;
    CHECK(strstr(reporter.lastFailedMessage, "xpected 1"));
    CHECK(strstr(reporter.lastFailedMessage, "was 2"));
}